

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,CBlockIndex *index)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  LogFlags in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  char (*in_stack_00000080) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000090;
  FlatFilePos block_pos;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffecc;
  FlatFilePos *in_stack_fffffffffffffed0;
  CBlockIndex *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  CBlockHeader *in_stack_fffffffffffffee8;
  anon_class_8_1_a81517f2 *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  int source_line;
  undefined1 local_b9;
  ConstevalFormatString<3U> in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  FlatFilePos *in_stack_ffffffffffffff88;
  CBlock *in_stack_ffffffffffffff90;
  BlockManager *in_stack_ffffffffffffff98;
  
  source_line = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  ReadBlockFromDisk::anon_class_8_1_a81517f2::operator()(in_stack_fffffffffffffef0);
  bVar2 = ReadBlockFromDisk(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff88);
  if (bVar2) {
    CBlockHeader::GetHash(in_stack_fffffffffffffee8);
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffed8);
    bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffed8,
                         (base_blob<256U> *)in_stack_fffffffffffffed0);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee0);
      CBlockIndex::ToString_abi_cxx11_
                ((CBlockIndex *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      FlatFilePos::ToString_abi_cxx11_(in_stack_fffffffffffffed0);
      uVar3 = 4;
      logging_function._M_str = (char *)in_stack_ffffffffffffff98;
      logging_function._M_len = (size_t)in_stack_ffffffffffffff90;
      source_file._M_str = (char *)in_stack_ffffffffffffff88;
      source_file._M_len = in_stack_ffffffffffffff80;
      LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,source_line,in_RSI,(Level)this,
                 in_stack_ffffffffffffff78,in_stack_00000080,in_stack_00000088,in_stack_00000090);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,uVar3));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,uVar3));
      local_b9 = false;
    }
    else {
      local_b9 = true;
    }
  }
  else {
    local_b9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_b9;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const CBlockIndex& index) const
{
    const FlatFilePos block_pos{WITH_LOCK(cs_main, return index.GetBlockPos())};

    if (!ReadBlockFromDisk(block, block_pos)) {
        return false;
    }
    if (block.GetHash() != index.GetBlockHash()) {
        LogError("%s: GetHash() doesn't match index for %s at %s\n", __func__, index.ToString(), block_pos.ToString());
        return false;
    }
    return true;
}